

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O1

void lj_dispatch_update(global_State *g)

{
  MSize *pMVar1;
  undefined4 *puVar2;
  byte bVar3;
  uint uVar4;
  undefined8 uVar5;
  uint uVar6;
  long lVar7;
  code *pcVar8;
  uint uVar9;
  code *pcVar10;
  code *pcVar11;
  code *pcVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  undefined4 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ushort uVar20;
  long lVar19;
  
  bVar3 = g->dispatchmode;
  uVar15 = g[1].strempty.hash & 1;
  uVar6 = 0xe;
  if (g[1].uvhead.field_5.field_1.next.gcptr32 == 0) {
    uVar6 = 0;
  }
  uVar4 = (uint)((g->hookmask & 0xc) != 0);
  uVar13 = (uint)g->hookmask << 3;
  uVar14 = uVar13 & 0x18 | uVar4 << 2 | uVar6 | uVar15;
  if (uVar14 == bVar3) {
    return;
  }
  g->dispatchmode = (uint8_t)uVar14;
  if ((uVar6 & 3 | uVar15) == 1) {
    pcVar12 = lj_BC_FUNCF;
    pcVar8 = lj_BC_LOOP;
    pcVar10 = lj_BC_ITERL;
    pcVar11 = lj_BC_FORL;
  }
  else {
    pcVar11 = *(code **)(g[0xb].gcroot + 0x1a);
    pcVar10 = *(code **)(g[0xb].gcroot + 0x20);
    pcVar8 = (code *)g[0xc].strhash;
    pcVar12 = lj_BC_IFUNCF;
  }
  *(code **)(g[0xb].gcroot + 0x18) = pcVar11;
  *(code **)(g[0xb].gcroot + 0x1e) = pcVar10;
  *(code **)(g[0xb].gcroot + 0x24) = pcVar8;
  auVar18 = _DAT_00155c60;
  uVar9 = uVar14 ^ bVar3;
  if ((uVar9 & 6) == 0) {
    if (uVar4 != 0 || (uVar6 & 6) != 0) goto LAB_0010cf9b;
    *(code **)(g[8].gcroot + 0x14) = pcVar11;
    *(code **)(g[8].gcroot + 0x1a) = pcVar10;
    *(code **)(g[8].gcroot + 0x20) = pcVar8;
    if ((uVar13 & 0x10) != 0) goto LAB_0010cf78;
    uVar5 = *(undefined8 *)(g[0xb].gcroot + 0xe);
    *(undefined8 *)(g[8].gcroot + 8) = *(undefined8 *)(g[0xb].gcroot + 0xc);
    *(undefined8 *)(g[8].gcroot + 10) = uVar5;
    *(undefined8 *)(g[8].gcroot + 0xc) = *(undefined8 *)(g[0xb].gcroot + 0x10);
    pcVar11 = *(code **)(g[0xb].gcroot + 0x12);
  }
  else {
    if (uVar4 != 0 || (uVar6 & 6) != 0) {
      pcVar11 = lj_vm_record;
      if ((uVar6 & 2) == 0) {
        pcVar11 = lj_vm_inshook;
      }
      lVar7 = 0;
      auVar17 = _DAT_00155c50;
      do {
        if (SUB164(auVar17 ^ auVar18,4) == -0x80000000 && SUB164(auVar17 ^ auVar18,0) < -0x7fffffab)
        {
          *(code **)(g[7].gcroot + lVar7 * 2 + -0x1c) = pcVar11;
          *(code **)(g[7].gcroot + lVar7 * 2 + -0x1a) = pcVar11;
        }
        lVar7 = lVar7 + 2;
        lVar19 = auVar17._8_8_;
        auVar17._0_8_ = auVar17._0_8_ + 2;
        auVar17._8_8_ = lVar19 + 2;
      } while (lVar7 != 0x56);
      goto LAB_0010cf9b;
    }
    memcpy(&g[7].stremptyz,&g[10].tmptv,0x2a8);
    if ((uVar13 & 0x10) == 0) goto LAB_0010cf9b;
LAB_0010cf78:
    pcVar11 = lj_vm_rethook;
    *(code **)(g[8].gcroot + 8) = lj_vm_rethook;
    *(code **)(g[8].gcroot + 10) = lj_vm_rethook;
    *(code **)(g[8].gcroot + 0xc) = lj_vm_rethook;
  }
  *(code **)(g[8].gcroot + 0xe) = pcVar11;
LAB_0010cf9b:
  if ((uVar9 & 8) != 0) {
    lVar7 = 0;
    if ((uVar14 & 8) == 0) {
      do {
        uVar20 = (ushort)((uint)*(undefined4 *)(lj_bc_ofs + lVar7 + 0x55) >> 0x10);
        *(code **)(&g[9].strmask + lVar7 * 2) =
             lj_BC_ISLT +
             ((ulong)CONCAT24(uVar20,*(undefined4 *)(lj_bc_ofs + lVar7 + 0x55)) & 0xffff);
        *(code **)(&g[9].strmask + lVar7 * 2 + 2) = lj_BC_ISLT + uVar20;
        lVar7 = lVar7 + 2;
      } while (lVar7 != 0x46);
    }
    else {
      do {
        pMVar1 = &g[9].strmask + lVar7 * 2;
        *pMVar1 = 0x15131b;
        pMVar1[1] = 0;
        pMVar1[2] = 0x15131b;
        pMVar1[3] = 0;
        lVar7 = lVar7 + 2;
      } while (lVar7 != 0x46);
    }
  }
  if ((uVar14 & 8) == 0) {
    *(code **)&g[9].strmask = pcVar12;
    *(code **)&g[9].gc = lj_BC_IFUNCV;
  }
  if ((bVar3 & 1) == 0 && uVar15 != 0) {
    auVar18 = ZEXT416(g[4].gcroot[0x11].gcptr32 * 2 - 1);
    auVar18 = pshuflw(auVar18,auVar18,0);
    uVar16 = auVar18._0_4_;
    lVar7 = 0;
    do {
      puVar2 = (undefined4 *)((long)&g[7].allocf + lVar7 * 2);
      *puVar2 = uVar16;
      puVar2[1] = uVar16;
      puVar2[2] = uVar16;
      puVar2[3] = uVar16;
      lVar7 = lVar7 + 8;
    } while (lVar7 != 0x40);
  }
  return;
}

Assistant:

void lj_dispatch_update(global_State *g)
{
  uint8_t oldmode = g->dispatchmode;
  uint8_t mode = 0;
#if LJ_HASJIT
  mode |= (G2J(g)->flags & JIT_F_ON) ? DISPMODE_JIT : 0;
  mode |= G2J(g)->state != LJ_TRACE_IDLE ?
	    (DISPMODE_REC|DISPMODE_INS|DISPMODE_CALL) : 0;
#endif
  mode |= (g->hookmask & (LUA_MASKLINE|LUA_MASKCOUNT)) ? DISPMODE_INS : 0;
  mode |= (g->hookmask & LUA_MASKCALL) ? DISPMODE_CALL : 0;
  mode |= (g->hookmask & LUA_MASKRET) ? DISPMODE_RET : 0;
  if (oldmode != mode) {  /* Mode changed? */
    ASMFunction *disp = G2GG(g)->dispatch;
    ASMFunction f_forl, f_iterl, f_loop, f_funcf, f_funcv;
    g->dispatchmode = mode;

    /* Hotcount if JIT is on, but not while recording. */
    if ((mode & (DISPMODE_JIT|DISPMODE_REC)) == DISPMODE_JIT) {
      f_forl = makeasmfunc(lj_bc_ofs[BC_FORL]);
      f_iterl = makeasmfunc(lj_bc_ofs[BC_ITERL]);
      f_loop = makeasmfunc(lj_bc_ofs[BC_LOOP]);
      f_funcf = makeasmfunc(lj_bc_ofs[BC_FUNCF]);
      f_funcv = makeasmfunc(lj_bc_ofs[BC_FUNCV]);
    } else {  /* Otherwise use the non-hotcounting instructions. */
      f_forl = disp[GG_LEN_DDISP+BC_IFORL];
      f_iterl = disp[GG_LEN_DDISP+BC_IITERL];
      f_loop = disp[GG_LEN_DDISP+BC_ILOOP];
      f_funcf = makeasmfunc(lj_bc_ofs[BC_IFUNCF]);
      f_funcv = makeasmfunc(lj_bc_ofs[BC_IFUNCV]);
    }
    /* Init static counting instruction dispatch first (may be copied below). */
    disp[GG_LEN_DDISP+BC_FORL] = f_forl;
    disp[GG_LEN_DDISP+BC_ITERL] = f_iterl;
    disp[GG_LEN_DDISP+BC_LOOP] = f_loop;

    /* Set dynamic instruction dispatch. */
    if ((oldmode ^ mode) & (DISPMODE_REC|DISPMODE_INS)) {
      /* Need to update the whole table. */
      if (!(mode & (DISPMODE_REC|DISPMODE_INS))) {  /* No ins dispatch? */
	/* Copy static dispatch table to dynamic dispatch table. */
	memcpy(&disp[0], &disp[GG_LEN_DDISP], GG_LEN_SDISP*sizeof(ASMFunction));
	/* Overwrite with dynamic return dispatch. */
	if ((mode & DISPMODE_RET)) {
	  disp[BC_RETM] = lj_vm_rethook;
	  disp[BC_RET] = lj_vm_rethook;
	  disp[BC_RET0] = lj_vm_rethook;
	  disp[BC_RET1] = lj_vm_rethook;
	}
      } else {
	/* The recording dispatch also checks for hooks. */
	ASMFunction f = (mode & DISPMODE_REC) ? lj_vm_record : lj_vm_inshook;
	uint32_t i;
	for (i = 0; i < GG_LEN_SDISP; i++)
	  disp[i] = f;
      }
    } else if (!(mode & (DISPMODE_REC|DISPMODE_INS))) {
      /* Otherwise set dynamic counting ins. */
      disp[BC_FORL] = f_forl;
      disp[BC_ITERL] = f_iterl;
      disp[BC_LOOP] = f_loop;
      /* Set dynamic return dispatch. */
      if ((mode & DISPMODE_RET)) {
	disp[BC_RETM] = lj_vm_rethook;
	disp[BC_RET] = lj_vm_rethook;
	disp[BC_RET0] = lj_vm_rethook;
	disp[BC_RET1] = lj_vm_rethook;
      } else {
	disp[BC_RETM] = disp[GG_LEN_DDISP+BC_RETM];
	disp[BC_RET] = disp[GG_LEN_DDISP+BC_RET];
	disp[BC_RET0] = disp[GG_LEN_DDISP+BC_RET0];
	disp[BC_RET1] = disp[GG_LEN_DDISP+BC_RET1];
      }
    }

    /* Set dynamic call dispatch. */
    if ((oldmode ^ mode) & DISPMODE_CALL) {  /* Update the whole table? */
      uint32_t i;
      if ((mode & DISPMODE_CALL) == 0) {  /* No call hooks? */
	for (i = GG_LEN_SDISP; i < GG_LEN_DDISP; i++)
	  disp[i] = makeasmfunc(lj_bc_ofs[i]);
      } else {
	for (i = GG_LEN_SDISP; i < GG_LEN_DDISP; i++)
	  disp[i] = lj_vm_callhook;
      }
    }
    if (!(mode & DISPMODE_CALL)) {  /* Overwrite dynamic counting ins. */
      disp[BC_FUNCF] = f_funcf;
      disp[BC_FUNCV] = f_funcv;
    }

#if LJ_HASJIT
    /* Reset hotcounts for JIT off to on transition. */
    if ((mode & DISPMODE_JIT) && !(oldmode & DISPMODE_JIT))
      lj_dispatch_init_hotcount(g);
#endif
  }
}